

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# videomenu.cpp
# Opt level: O0

void SetModesMenu(int w,int h,int bits)

{
  FOptionMenuItem *pFVar1;
  int intval;
  FOptionMenuDescriptor *this;
  char local_78 [8];
  char strtemp [64];
  FName local_30;
  FName local_2c;
  FOptionMenuItem *local_28;
  FOptionMenuItem *it;
  FOptionMenuDescriptor *opt;
  uint local_10;
  int bits_local;
  int h_local;
  int w_local;
  
  opt._4_4_ = bits;
  local_10 = h;
  bits_local = w;
  intval = FindBits(bits);
  FIntCVar::operator=(&DummyDepthCvar,intval);
  this = GetVideoModeMenu();
  it = (FOptionMenuItem *)this;
  if (this != (FOptionMenuDescriptor *)0x0) {
    if (testingmode < 2) {
      FName::FName(&local_2c,NAME_VMEnterText);
      local_28 = FOptionMenuDescriptor::GetItem(this,&local_2c);
      if (local_28 != (FOptionMenuItem *)0x0) {
        (*(local_28->super_FListMenuItem)._vptr_FListMenuItem[10])(local_28,0);
      }
      pFVar1 = it;
      FName::FName(&local_30,NAME_VMTestText);
      local_28 = FOptionMenuDescriptor::GetItem((FOptionMenuDescriptor *)pFVar1,&local_30);
      if (local_28 != (FOptionMenuItem *)0x0) {
        (*(local_28->super_FListMenuItem)._vptr_FListMenuItem[10])(local_28,0);
      }
    }
    else {
      FName::FName((FName *)(strtemp + 0x3c),NAME_VMTestText);
      local_28 = FOptionMenuDescriptor::GetItem(this,(FName *)(strtemp + 0x3c));
      if (local_28 != (FOptionMenuItem *)0x0) {
        (*(local_28->super_FListMenuItem)._vptr_FListMenuItem[10])(local_28,0,1);
      }
      pFVar1 = it;
      FName::FName((FName *)(strtemp + 0x38),NAME_VMEnterText);
      local_28 = FOptionMenuDescriptor::GetItem
                           ((FOptionMenuDescriptor *)pFVar1,(FName *)(strtemp + 0x38));
      if (local_28 != (FOptionMenuItem *)0x0) {
        mysnprintf(local_78,0x40,"TESTING %dx%dx%d",(ulong)(uint)bits_local,(ulong)local_10,
                   (ulong)opt._4_4_);
        (*(local_28->super_FListMenuItem)._vptr_FListMenuItem[10])(local_28,0,1);
        (*(local_28->super_FListMenuItem)._vptr_FListMenuItem[8])(local_28,0,local_78);
      }
    }
  }
  BuildModesList(bits_local,local_10,opt._4_4_);
  return;
}

Assistant:

static void SetModesMenu (int w, int h, int bits)
{
	DummyDepthCvar = FindBits (bits);

	FOptionMenuDescriptor *opt = GetVideoModeMenu();
	if (opt != NULL)
	{
		FOptionMenuItem *it;
		if (testingmode <= 1)
		{
			it = opt->GetItem(NAME_VMEnterText);
			if (it != NULL) it->SetValue(0, 0);
			it = opt->GetItem(NAME_VMTestText);
			if (it != NULL) it->SetValue(0, 0);
		}
		else
		{

			it = opt->GetItem(NAME_VMTestText);
			if (it != NULL) it->SetValue(0, 1);
			it = opt->GetItem(NAME_VMEnterText);
			if (it != NULL) 
			{
				char strtemp[64];
				mysnprintf (strtemp, countof(strtemp), "TESTING %dx%dx%d", w, h, bits);
				it->SetValue(0, 1);
				it->SetString(0, strtemp);
			}
		}
	}
	BuildModesList (w, h, bits);
}